

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O3

void __thiscall
EOPlus::Parser::ParseRuleActionBlock
          (Parser *this,deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_> *rules,
          deque<EOPlus::Action,_std::allocator<EOPlus::Action>_> *actions,
          function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *custom_handler,
          function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *error_handler)

{
  Expression *__x;
  deque<util::variant,_std::allocator<util::variant>_> *__x_00;
  variant *this_00;
  iterator *piVar1;
  Parser_Token_Server_Base *pPVar2;
  bool bVar3;
  int iVar4;
  _Alloc_hider _Var5;
  long *plVar6;
  Token t;
  Action action;
  Rule rule;
  undefined1 local_588 [24];
  _Alloc_hider local_570;
  size_type local_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_560;
  bool local_550;
  bool bStack_54f;
  bool bStack_54e;
  bool bStack_54d;
  bool bStack_54c;
  undefined3 uStack_54b;
  var_type local_548;
  int local_540;
  _Any_data *local_538;
  _Any_data *local_530;
  deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_> *local_528;
  string local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  undefined1 local_4e0 [88];
  _Alloc_hider local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  deque<util::variant,_std::allocator<util::variant>_> local_468;
  deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> dStack_418;
  _Alloc_hider local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  deque<util::variant,_std::allocator<util::variant>_> dStack_3a8;
  undefined1 local_358 [24];
  _Alloc_hider local_340;
  long local_330 [3];
  var_type local_318;
  int local_310;
  undefined1 local_308 [24];
  _Alloc_hider local_2f0;
  long local_2e0 [3];
  var_type local_2c8;
  int local_2c0;
  Rule local_2b8;
  variant local_70;
  
  local_528 = rules;
  util::variant::variant(&local_70);
  local_588._0_4_ = Invalid;
  local_588._8_4_ = local_70.val_int;
  local_588._12_4_ = local_70._4_4_;
  local_588._16_4_ = local_70.val_float._0_4_;
  local_588._20_4_ = local_70.val_float._4_4_;
  local_570._M_p = (pointer)&local_560;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_570,local_70.val_string._M_dataplus._M_p,
             local_70.val_string._M_dataplus._M_p + local_70.val_string._M_string_length);
  local_548 = local_70.type;
  local_550 = local_70.val_bool;
  bStack_54f = local_70.cache_val[0];
  bStack_54e = local_70.cache_val[1];
  bStack_54d = local_70.cache_val[2];
  bStack_54c = local_70.cache_val[3];
  uStack_54b = local_70._53_3_;
  local_540 = 0;
  local_538 = (_Any_data *)custom_handler;
  local_530 = (_Any_data *)error_handler;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.val_string._M_dataplus._M_p != &local_70.val_string.field_2) {
    operator_delete(local_70.val_string._M_dataplus._M_p,
                    local_70.val_string.field_2._M_allocated_capacity + 1);
  }
  this_00 = (variant *)(local_588 + 8);
  piVar1 = (iterator *)
           ((long)&local_2b8.expr.scopes.
                   super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                   super__Deque_impl_data + 0x10);
  __x = &local_2b8.action.expr;
  __x_00 = &local_2b8.action.expr.args;
LAB_001400a6:
  do {
    while( true ) {
      bVar3 = GetToken(this,(Token *)local_588,0x41);
      if (!bVar3) goto LAB_00140676;
      if (local_588._0_4_ != Symbol) break;
      util::variant::GetString_abi_cxx11_((string *)&local_2b8,this_00);
      iVar4 = std::__cxx11::string::compare((char *)&local_2b8);
      if ((iterator *)
          CONCAT44(local_2b8.expr.scopes.
                   super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                   super__Deque_impl_data._M_map._4_4_,
                   local_2b8.expr.scopes.
                   super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                   super__Deque_impl_data._M_map._0_4_) != piVar1) {
        operator_delete((undefined1 *)
                        CONCAT44(local_2b8.expr.scopes.
                                 super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                                 _M_impl.super__Deque_impl_data._M_map._4_4_,
                                 local_2b8.expr.scopes.
                                 super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                                 _M_impl.super__Deque_impl_data._M_map._0_4_),
                        (ulong)((long)&(local_2b8.expr.scopes.
                                        super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_cur)->type + 1))
        ;
      }
      if (iVar4 == 0) goto LAB_001406d8;
      util::variant::GetString_abi_cxx11_((string *)&local_2b8,this_00);
      iVar4 = std::__cxx11::string::compare((char *)&local_2b8);
      if ((iterator *)
          CONCAT44(local_2b8.expr.scopes.
                   super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                   super__Deque_impl_data._M_map._4_4_,
                   local_2b8.expr.scopes.
                   super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                   super__Deque_impl_data._M_map._0_4_) != piVar1) {
        operator_delete((undefined1 *)
                        CONCAT44(local_2b8.expr.scopes.
                                 super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                                 _M_impl.super__Deque_impl_data._M_map._4_4_,
                                 local_2b8.expr.scopes.
                                 super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                                 _M_impl.super__Deque_impl_data._M_map._0_4_),
                        (ulong)((long)&(local_2b8.expr.scopes.
                                        super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_cur)->type + 1))
        ;
      }
      if (iVar4 != 0) {
        pPVar2 = (this->tok)._M_t.
                 super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
        local_358._0_4_ = local_588._0_4_;
        local_358._8_4_ = local_588._8_4_;
        local_358._12_4_ = local_588._12_4_;
        local_358._16_4_ = local_588._16_4_;
        local_358._20_4_ = local_588._20_4_;
        plVar6 = local_330;
        local_340._M_p = (pointer)plVar6;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_340,local_570._M_p,local_570._M_p + local_568);
        local_318 = local_548;
        local_330[2]._0_1_ = local_550;
        local_330[2]._1_1_ = bStack_54f;
        local_330[2]._2_1_ = bStack_54e;
        local_330[2]._3_1_ = bStack_54d;
        local_330[2]._4_1_ = bStack_54c;
        local_330[2]._5_3_ = uStack_54b;
        local_310 = local_540;
        Parser_Token_Server_Base::PutBack(pPVar2,(Token *)local_358);
        _Var5._M_p = local_340._M_p;
LAB_00140666:
        if ((long *)_Var5._M_p != plVar6) {
          operator_delete(_Var5._M_p,*plVar6 + 1);
        }
LAB_00140676:
        local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_500,"rule/action/if/elseif/else","");
        if (*(long *)(local_530 + 1) == 0) {
          std::__throw_bad_function_call();
        }
        (**(code **)(local_530->_M_pod_data + 0x18))(local_530,&local_500);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != &local_500.field_2) {
          operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
        }
LAB_001406d8:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570._M_p != &local_560) {
          operator_delete(local_570._M_p,local_560._M_allocated_capacity + 1);
        }
        return;
      }
    }
  } while (local_588._0_4_ != Identifier);
  util::variant::GetString_abi_cxx11_((string *)&local_2b8,this_00);
  iVar4 = std::__cxx11::string::compare((char *)&local_2b8);
  if ((iterator *)
      CONCAT44(local_2b8.expr.scopes.
               super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
               super__Deque_impl_data._M_map._4_4_,
               local_2b8.expr.scopes.
               super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
               super__Deque_impl_data._M_map._0_4_) != piVar1) {
    operator_delete((undefined1 *)
                    CONCAT44(local_2b8.expr.scopes.
                             super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                             _M_impl.super__Deque_impl_data._M_map._4_4_,
                             local_2b8.expr.scopes.
                             super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                             _M_impl.super__Deque_impl_data._M_map._0_4_),
                    (ulong)((long)&(local_2b8.expr.scopes.
                                    super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_cur)->type + 1));
  }
  if (iVar4 == 0) {
    ParseRule(&local_2b8,this);
    std::deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>::emplace_back<EOPlus::Rule>
              (local_528,&local_2b8);
  }
  else {
    util::variant::GetString_abi_cxx11_((string *)&local_2b8,this_00);
    iVar4 = std::__cxx11::string::compare((char *)&local_2b8);
    if ((iterator *)
        CONCAT44(local_2b8.expr.scopes.
                 super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                 super__Deque_impl_data._M_map._4_4_,
                 local_2b8.expr.scopes.
                 super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                 super__Deque_impl_data._M_map._0_4_) != piVar1) {
      operator_delete((undefined1 *)
                      CONCAT44(local_2b8.expr.scopes.
                               super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                               _M_impl.super__Deque_impl_data._M_map._4_4_,
                               local_2b8.expr.scopes.
                               super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                               _M_impl.super__Deque_impl_data._M_map._0_4_),
                      (ulong)((long)&(local_2b8.expr.scopes.
                                      super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_cur)->type + 1));
    }
    if (iVar4 == 0) {
      ParseAction((Action *)&local_2b8,this);
      std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::emplace_back<EOPlus::Action>
                (actions,(Action *)&local_2b8);
LAB_001402d4:
      std::deque<util::variant,_std::allocator<util::variant>_>::~deque
                (&local_2b8.action.cond_expr.args);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8.action.cond_expr.function._M_dataplus._M_p !=
          &local_2b8.action.cond_expr.function.field_2) {
        operator_delete(local_2b8.action.cond_expr.function._M_dataplus._M_p,
                        local_2b8.action.cond_expr.function.field_2._M_allocated_capacity + 1);
      }
      std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::~deque
                (&local_2b8.action.cond_expr.scopes);
      std::deque<util::variant,_std::allocator<util::variant>_>::~deque
                ((deque<util::variant,_std::allocator<util::variant>_> *)
                 ((long)&local_2b8.expr.args.
                         super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                         super__Deque_impl_data + 8));
      if ((undefined1 *)local_2b8.expr.function._M_string_length !=
          (undefined1 *)((long)&local_2b8.expr.function.field_2 + 8)) {
        operator_delete((void *)local_2b8.expr.function._M_string_length,
                        local_2b8.expr.function.field_2._8_8_ + 1);
      }
      std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::~deque
                ((deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)
                 ((long)&local_2b8.expr.scopes.
                         super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                         super__Deque_impl_data + 8));
      goto LAB_001400a6;
    }
    util::variant::GetString_abi_cxx11_((string *)&local_2b8,this_00);
    iVar4 = std::__cxx11::string::compare((char *)&local_2b8);
    if ((iterator *)
        CONCAT44(local_2b8.expr.scopes.
                 super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                 super__Deque_impl_data._M_map._4_4_,
                 local_2b8.expr.scopes.
                 super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                 super__Deque_impl_data._M_map._0_4_) != piVar1) {
      operator_delete((undefined1 *)
                      CONCAT44(local_2b8.expr.scopes.
                               super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                               _M_impl.super__Deque_impl_data._M_map._4_4_,
                               local_2b8.expr.scopes.
                               super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                               _M_impl.super__Deque_impl_data._M_map._0_4_),
                      (ulong)((long)&(local_2b8.expr.scopes.
                                      super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_cur)->type + 1));
    }
    if (iVar4 == 0) {
      ParseRule(&local_2b8,this);
      Action::Action((Action *)local_4e0);
      local_4e0._0_4_ = If;
      std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::operator=
                ((deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)(local_4e0 + 8),
                 (deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)&local_2b8);
      std::__cxx11::string::_M_assign((string *)&local_488);
      std::deque<util::variant,_std::allocator<util::variant>_>::operator=
                (&local_468,&local_2b8.expr.args);
      std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::operator=(&dStack_418,&__x->scopes)
      ;
      std::__cxx11::string::_M_assign((string *)&local_3c8);
      std::deque<util::variant,_std::allocator<util::variant>_>::operator=(&dStack_3a8,__x_00);
      std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::push_back
                (actions,(value_type *)local_4e0);
    }
    else {
      util::variant::GetString_abi_cxx11_((string *)&local_2b8,this_00);
      iVar4 = std::__cxx11::string::compare((char *)&local_2b8);
      if (iVar4 == 0) {
        bVar3 = true;
      }
      else {
        util::variant::GetString_abi_cxx11_((string *)local_4e0,this_00);
        iVar4 = std::__cxx11::string::compare((char *)local_4e0);
        bVar3 = iVar4 == 0;
        if ((undefined1 *)CONCAT44(local_4e0._4_4_,local_4e0._0_4_) != local_4e0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_4e0._4_4_,local_4e0._0_4_),
                          local_4e0._16_8_ + 1);
        }
      }
      if ((iterator *)
          CONCAT44(local_2b8.expr.scopes.
                   super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                   super__Deque_impl_data._M_map._4_4_,
                   local_2b8.expr.scopes.
                   super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                   super__Deque_impl_data._M_map._0_4_) != piVar1) {
        operator_delete((undefined1 *)
                        CONCAT44(local_2b8.expr.scopes.
                                 super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                                 _M_impl.super__Deque_impl_data._M_map._4_4_,
                                 local_2b8.expr.scopes.
                                 super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                                 _M_impl.super__Deque_impl_data._M_map._0_4_),
                        (ulong)((long)&(local_2b8.expr.scopes.
                                        super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_cur)->type + 1))
        ;
      }
      if (!bVar3) {
        util::variant::GetString_abi_cxx11_((string *)&local_2b8,this_00);
        iVar4 = std::__cxx11::string::compare((char *)&local_2b8);
        if ((iterator *)
            CONCAT44(local_2b8.expr.scopes.
                     super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                     super__Deque_impl_data._M_map._4_4_,
                     local_2b8.expr.scopes.
                     super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                     super__Deque_impl_data._M_map._0_4_) != piVar1) {
          operator_delete((undefined1 *)
                          CONCAT44(local_2b8.expr.scopes.
                                   super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                                   _M_impl.super__Deque_impl_data._M_map._4_4_,
                                   local_2b8.expr.scopes.
                                   super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                                   _M_impl.super__Deque_impl_data._M_map._0_4_),
                          (ulong)((long)&(local_2b8.expr.scopes.
                                          super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>
                                          ._M_impl.super__Deque_impl_data._M_start._M_cur)->type + 1
                                 ));
        }
        if (iVar4 == 0) {
          ParseAction((Action *)&local_2b8,this);
          local_2b8.expr.scopes.super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
          _M_impl.super__Deque_impl_data._M_map._0_4_ = 2;
          std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::push_back
                    (actions,(value_type *)&local_2b8);
          goto LAB_001402d4;
        }
        util::variant::GetString_abi_cxx11_(&local_520,this_00);
        if (*(long *)(local_538 + 1) == 0) {
          std::__throw_bad_function_call();
        }
        bVar3 = (**(code **)(local_538->_M_pod_data + 0x18))(local_538,&local_520);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520._M_dataplus._M_p != &local_520.field_2) {
          operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
        }
        if (!bVar3) {
          pPVar2 = (this->tok)._M_t.
                   super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
          local_308._0_4_ = local_588._0_4_;
          local_308._8_4_ = local_588._8_4_;
          local_308._12_4_ = local_588._12_4_;
          local_308._16_4_ = local_588._16_4_;
          local_308._20_4_ = local_588._20_4_;
          plVar6 = local_2e0;
          local_2f0._M_p = (pointer)plVar6;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2f0,local_570._M_p,local_570._M_p + local_568);
          local_2c8 = local_548;
          local_2e0[2]._0_1_ = local_550;
          local_2e0[2]._1_1_ = bStack_54f;
          local_2e0[2]._2_1_ = bStack_54e;
          local_2e0[2]._3_1_ = bStack_54d;
          local_2e0[2]._4_1_ = bStack_54c;
          local_2e0[2]._5_3_ = uStack_54b;
          local_2c0 = local_540;
          Parser_Token_Server_Base::PutBack(pPVar2,(Token *)local_308);
          _Var5._M_p = local_2f0._M_p;
          goto LAB_00140666;
        }
        goto LAB_001400a6;
      }
      ParseRule(&local_2b8,this);
      Action::Action((Action *)local_4e0);
      local_4e0._0_4_ = ElseIf;
      std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::operator=
                ((deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)(local_4e0 + 8),
                 (deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)&local_2b8);
      std::__cxx11::string::_M_assign((string *)&local_488);
      std::deque<util::variant,_std::allocator<util::variant>_>::operator=
                (&local_468,&local_2b8.expr.args);
      std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::operator=(&dStack_418,&__x->scopes)
      ;
      std::__cxx11::string::_M_assign((string *)&local_3c8);
      std::deque<util::variant,_std::allocator<util::variant>_>::operator=(&dStack_3a8,__x_00);
      std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::push_back
                (actions,(value_type *)local_4e0);
    }
    std::deque<util::variant,_std::allocator<util::variant>_>::~deque(&dStack_3a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_p != &local_3b8) {
      operator_delete(local_3c8._M_p,local_3b8._M_allocated_capacity + 1);
    }
    std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::~deque(&dStack_418);
    std::deque<util::variant,_std::allocator<util::variant>_>::~deque(&local_468);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_p != &local_478) {
      operator_delete(local_488._M_p,local_478._M_allocated_capacity + 1);
    }
    std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::~deque
              ((deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)(local_4e0 + 8));
  }
  Rule::~Rule(&local_2b8);
  goto LAB_001400a6;
}

Assistant:

void Parser::ParseRuleActionBlock(std::deque<Rule>& rules, std::deque<Action>& actions, std::function<bool(std::string)> custom_handler, std::function<void(std::string)> error_handler)
	{
		Token t;

		while (this->GetToken(t, Token::Identifier | Token::Symbol))
		{
			if (t.type == Token::Identifier)
			{
				if (std::string(t.data) == "rule")
				{
					rules.push_back(this->ParseRule());
				}
				else if (std::string(t.data) == "action")
				{
					actions.push_back(this->ParseAction());
				}
				else if (std::string(t.data) == "if")
				{
					Rule rule = this->ParseRule();
					Action action;
					action.cond = Action::If;
					action.cond_expr = rule.expr;
					action.expr = rule.action.expr;
					actions.push_back(action);
				}
				else if (std::string(t.data) == "elseif" || std::string(t.data) == "elif")
				{
					Rule rule = this->ParseRule();
					Action action;
					action.cond = Action::ElseIf;
					action.cond_expr = rule.expr;
					action.expr = rule.action.expr;
					actions.push_back(action);
				}
				else if (std::string(t.data) == "else")
				{
					Action action = this->ParseAction();
					action.cond = Action::Else;
					actions.push_back(action);
				}
				else
				{
					if (!custom_handler(std::string(t.data)))
					{
						this->tok->PutBack(t);
						break;
					}
				}
			}
			else if (t.type == Token::Symbol)
			{
				if (std::string(t.data) == "}")
				{
					return;
				}
				else if (std::string(t.data) == ";")
				{
					continue;
				}
				else
				{
					this->tok->PutBack(t);
					break;
				}
			}
		}

		// PARSER_ERROR_GOT("Expected rule-action-block entry (rule/action) or closing brace '}'.")
		error_handler("rule/action/if/elseif/else");
	}